

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O1

bool libcellml::areEqual(double a,double b)

{
  int iVar1;
  bool in_DL;
  bool fullPrecision;
  bool bVar2;
  string local_48;
  string local_28;
  
  convertToString_abi_cxx11_(&local_48,(libcellml *)0x1,a + 0.0,in_DL);
  convertToString_abi_cxx11_(&local_28,(libcellml *)0x1,b + 0.0,fullPrecision);
  if (local_48._M_string_length == local_28._M_string_length) {
    if (local_48._M_string_length == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_48._M_dataplus._M_p,local_28._M_dataplus._M_p,local_48._M_string_length);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool areEqual(double a, double b)
{
    // Note: we add 0.0 in case a is, for instance, equal to 0.0 and b is equal
    //       to -0.0.
    return convertToString(a + 0.0) == convertToString(b + 0.0);
}